

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometricModel.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
csm::GeometricModel::getParameterSetIndices
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GeometricModel *this,Set pSet)

{
  int iVar1;
  int iVar2;
  int local_2c;
  
  iVar1 = (*(this->super_Model)._vptr_Model[0x13])(this);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,(long)iVar1);
  local_2c = 0;
  do {
    if (iVar1 <= local_2c) {
      return __return_storage_ptr__;
    }
    iVar2 = (*(this->super_Model)._vptr_Model[0x1b])(this);
    if (iVar2 == 3) {
      if (pSet != ADJUSTABLE) {
LAB_00118b00:
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_2c);
      }
    }
    else if ((pSet != NON_ADJUSTABLE) && (iVar2 != 0)) goto LAB_00118b00;
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

std::vector<int> GeometricModel::getParameterSetIndices(param::Set pSet) const
{
   const int NUM_PARMS = getNumParameters();
   
   std::vector<int> indices;
   indices.reserve(NUM_PARMS);
   
   for (int i = 0; i < NUM_PARMS; ++i)
   {
      param::Type pType = getParameterType(i);
      if (pType == param::FIXED)
      {
         if (pSet != param::ADJUSTABLE) indices.push_back(i);
      }
      else if ((pType != param::NONE) && (pSet != param::NON_ADJUSTABLE))
      {
         indices.push_back(i);
      }
   }
   return indices;
}